

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  pointer pcVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00185d60;
  TestCaseInfo::TestCaseInfo(&this->testInfo,_testInfo);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar2 = _totals->error;
  uVar3 = *(undefined4 *)&_totals->field_0x4;
  sVar9 = (_totals->assertions).passed;
  uVar4 = *(undefined4 *)((long)&(_totals->assertions).passed + 4);
  sVar10 = (_totals->assertions).failed;
  uVar5 = *(undefined4 *)((long)&(_totals->assertions).failed + 4);
  sVar11 = (_totals->assertions).failedButOk;
  uVar6 = *(undefined4 *)((long)&(_totals->assertions).failedButOk + 4);
  uVar7 = *(undefined4 *)((long)&(_totals->testCases).passed + 4);
  sVar12 = (_totals->testCases).failed;
  uVar8 = *(undefined4 *)((long)&(_totals->testCases).failed + 4);
  *(int *)&(this->totals).testCases.passed = (int)(_totals->testCases).passed;
  *(undefined4 *)((long)&(this->totals).testCases.passed + 4) = uVar7;
  *(int *)&(this->totals).testCases.failed = (int)sVar12;
  *(undefined4 *)((long)&(this->totals).testCases.failed + 4) = uVar8;
  *(int *)&(this->totals).assertions.failed = (int)sVar10;
  *(undefined4 *)((long)&(this->totals).assertions.failed + 4) = uVar5;
  *(int *)&(this->totals).assertions.failedButOk = (int)sVar11;
  *(undefined4 *)((long)&(this->totals).assertions.failedButOk + 4) = uVar6;
  (this->totals).error = iVar2;
  *(undefined4 *)&(this->totals).field_0x4 = uVar3;
  *(int *)&(this->totals).assertions.passed = (int)sVar9;
  *(undefined4 *)((long)&(this->totals).assertions.passed + 4) = uVar4;
  (this->stdOut)._M_dataplus._M_p = (pointer)&(this->stdOut).field_2;
  pcVar1 = (_stdOut->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stdOut,pcVar1,pcVar1 + _stdOut->_M_string_length);
  (this->stdErr)._M_dataplus._M_p = (pointer)&(this->stdErr).field_2;
  pcVar1 = (_stdErr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stdErr,pcVar1,pcVar1 + _stdErr->_M_string_length);
  this->aborting = _aborting;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string const& _stdOut,
                                   std::string const& _stdErr,
                                   bool _aborting )
    : testInfo( _testInfo ),
        totals( _totals ),
        stdOut( _stdOut ),
        stdErr( _stdErr ),
        aborting( _aborting )
    {}